

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPMI_ECC_CURVE_Unmarshal(TPMI_ECC_CURVE *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  UINT16 UVar2;
  TPM_RC TVar3;
  
  iVar1 = *size;
  *size = iVar1 + -2;
  TVar3 = 0x9a;
  if (1 < iVar1) {
    UVar2 = ByteArrayToUint16(*buffer);
    *target = UVar2;
    *buffer = *buffer + 2;
    TVar3 = 0xa6;
    if ((*target < 0x11) && ((0x1000cU >> (*target & 0x1f) & 1) != 0)) {
      TVar3 = 0;
    }
  }
  return TVar3;
}

Assistant:

TPM_RC
TPMI_ECC_CURVE_Unmarshal(TPMI_ECC_CURVE *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPM_ECC_CURVE_Unmarshal((TPM_ECC_CURVE *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    switch (*target) {
#if         ECC_BN_P256
        case TPM_ECC_BN_P256:
#endif // ECC_BN_P256
#if         ECC_BN_P638
        case TPM_ECC_BN_P638:
#endif // ECC_BN_P638
#if         ECC_NIST_P192
        case TPM_ECC_NIST_P192:
#endif // ECC_NIST_P192
#if         ECC_NIST_P224
        case TPM_ECC_NIST_P224:
#endif // ECC_NIST_P224
#if         ECC_NIST_P256
        case TPM_ECC_NIST_P256:
#endif // ECC_NIST_P256
#if         ECC_NIST_P384
        case TPM_ECC_NIST_P384:
#endif // ECC_NIST_P384
#if         ECC_NIST_P521
        case TPM_ECC_NIST_P521:
#endif // ECC_NIST_P521
#if         ECC_SM2_P256
        case TPM_ECC_SM2_P256:
#endif // ECC_SM2_P256
            break;
        default:
            return TPM_RC_CURVE;
    }
    return TPM_RC_SUCCESS;
}